

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_example.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::ApiExample::OnSubscriptionStatus
          (ApiExample *this,shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *event)

{
  logger *this_00;
  SubscriptionStatus local_4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = (this->logger_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bidfx_public_api::SubscriptionStatusEvent::GetSubject();
  local_4c = bidfx_public_api::SubscriptionStatusEvent::GetStatus();
  bidfx_public_api::SubscriptionStatusEvent::GetExplanation_abi_cxx11_();
  spdlog::logger::
  info<bidfx_public_api::price::subject::Subject,bidfx_public_api::SubscriptionStatus,std::__cxx11::string>
            (this_00,"Subscription Status Update: {} -> {}: {}",(Subject *)&local_48,&local_4c,
             &local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void ApiExample::OnSubscriptionStatus(std::shared_ptr<SubscriptionStatusEvent> event)
{
    logger_->info("Subscription Status Update: {} -> {}: {}", event->GetSubject(), event->GetStatus(), event->GetExplanation());
}